

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O0

EStatusCode __thiscall
PDFWriter::ContinuePDF
          (PDFWriter *this,string *inOutputFilePath,string *inStateFilePath,
          string *inOptionalModifiedFile,LogConfiguration *inLogConfiguration)

{
  EStatusCode EVar1;
  long lVar2;
  IByteReaderWithPosition *inSourceStream;
  PDFParsingOptions *inOptions;
  IByteWriterWithPosition *inOutputStream;
  EStatusCode status;
  LogConfiguration *inLogConfiguration_local;
  string *inOptionalModifiedFile_local;
  string *inStateFilePath_local;
  string *inOutputFilePath_local;
  PDFWriter *this_local;
  
  SetupLog(this,inLogConfiguration);
  EVar1 = OutputFile::OpenFile(&this->mOutputFile,inOutputFilePath,true);
  if (EVar1 != eSuccess) {
    return EVar1;
  }
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    EVar1 = InputFile::OpenFile(&this->mModifiedFile,inOptionalModifiedFile);
    if (EVar1 != eSuccess) {
      return EVar1;
    }
    inSourceStream = InputFile::GetInputStream(&this->mModifiedFile);
    inOptions = PDFParsingOptions::DefaultPDFParsingOptions();
    EVar1 = PDFParser::StartPDFParsing(&this->mModifiedFileParser,inSourceStream,inOptions);
    if (EVar1 != eSuccess) {
      return EVar1;
    }
  }
  inOutputStream = OutputFile::GetOutputStream(&this->mOutputFile);
  ObjectsContext::SetOutputStream(&this->mObjectsContext,inOutputStream);
  PDFHummus::DocumentContext::SetOutputFileInformation(&this->mDocumentContext,&this->mOutputFile);
  EVar1 = SetupState(this,inStateFilePath);
  return EVar1;
}

Assistant:

EStatusCode PDFWriter::ContinuePDF(const std::string& inOutputFilePath,
								   const std::string& inStateFilePath,
                                   const std::string& inOptionalModifiedFile,
								   const LogConfiguration& inLogConfiguration)
{


	SetupLog(inLogConfiguration);
	EStatusCode status = mOutputFile.OpenFile(inOutputFilePath,true);
	if(status != eSuccess)
		return status;

    if(inOptionalModifiedFile.size() != 0)
    {
        // setup parser for reading modified file
        status = mModifiedFile.OpenFile(inOptionalModifiedFile);
        if(status != eSuccess)
            return status;

        status = mModifiedFileParser.StartPDFParsing(mModifiedFile.GetInputStream());
        if(status != eSuccess)
            return status;
    }

	mObjectsContext.SetOutputStream(mOutputFile.GetOutputStream());
	mDocumentContext.SetOutputFileInformation(&mOutputFile);

	return SetupState(inStateFilePath);


}